

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateSettingsResourcePrefsFile(cmExtraEclipseCDT4Generator *this)

{
  byte bVar1;
  bool bVar2;
  LocalGeneratorVector *this_00;
  const_reference this_01;
  pointer this_02;
  cmMakefile *this_03;
  ostream *poVar3;
  string *psVar4;
  allocator<char> local_2e1;
  string local_2e0;
  cmValue local_2c0;
  cmValue encoding;
  undefined1 local_2a8 [8];
  cmGeneratedFileStream fout;
  string filename;
  cmMakefile *mf;
  value_type *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  this_00 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  this_01 = std::
            vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ::operator[](this_00,0);
  this_02 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                      (this_01);
  this_03 = cmLocalGenerator::GetMakefile(this_02);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout.field_0x260,&this->HomeOutputDirectory,
                 "/.settings/org.eclipse.core.resources.prefs");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2a8,(string *)&fout.field_0x260,false,None);
  bVar1 = std::ios::operator!((ios *)(local_2a8 + (long)*(_func_int **)((long)local_2a8 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)local_2a8,"eclipse.preferences.version=1\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"CMAKE_ECLIPSE_RESOURCE_ENCODING",&local_2e1);
    local_2c0 = cmMakefile::GetDefinition(this_03,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    bVar2 = cmValue::operator_cast_to_bool(&local_2c0);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)local_2a8,"encoding/<project>=");
      psVar4 = cmValue::operator*[abi_cxx11_(&local_2c0);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,'\n');
    }
    encoding.Value._0_4_ = 0;
  }
  else {
    encoding.Value._0_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2a8);
  std::__cxx11::string::~string((string *)&fout.field_0x260);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSettingsResourcePrefsFile()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename =
    this->HomeOutputDirectory + "/.settings/org.eclipse.core.resources.prefs";

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  fout << "eclipse.preferences.version=1\n";
  cmValue encoding = mf->GetDefinition("CMAKE_ECLIPSE_RESOURCE_ENCODING");
  if (encoding) {
    fout << "encoding/<project>=" << *encoding << '\n';
  }
}